

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

Integer pnga_pgroup_split_irreg(Integer grp,Integer mycolor)

{
  char *op;
  void *__ptr;
  Integer IVar1;
  Integer IVar2;
  long in_RSI;
  Integer in_RDI;
  Integer *unaff_retaddr;
  Integer *color_arr;
  Integer *nodes;
  Integer icnt;
  Integer i;
  Integer grp_id;
  Integer default_grp;
  Integer me;
  Integer nprocs;
  Integer in_stack_00000148;
  char *in_stack_00000150;
  Integer IVar3;
  long lVar4;
  void *x;
  long lVar5;
  Integer in_stack_ffffffffffffffd0;
  
  IVar3 = 0;
  op = (char *)malloc(GAnproc << 3);
  __ptr = malloc(GAnproc << 3);
  if (in_RSI < 0) {
    pnga_error(in_stack_00000150,in_stack_00000148);
  }
  pnga_pgroup_get_default();
  pnga_pgroup_set_default((Integer)__ptr);
  IVar1 = pnga_nnodes();
  IVar2 = pnga_nodeid();
  for (x = (void *)0x0; (long)x < IVar1; x = (void *)((long)x + 1)) {
    *(undefined8 *)((long)__ptr + (long)x * 8) = 0;
  }
  *(long *)((long)__ptr + IVar2 * 8) = in_RSI;
  pnga_type_f2c(0x3f2);
  pnga_gop(in_stack_ffffffffffffffd0,x,IVar3,op);
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < IVar1; lVar5 = lVar5 + 1) {
    if (*(long *)((long)__ptr + lVar5 * 8) == in_RSI) {
      *(long *)(op + lVar4 * 8) = lVar5;
      lVar4 = lVar4 + 1;
    }
  }
  IVar3 = pnga_pgroup_create(unaff_retaddr,in_RDI);
  pnga_pgroup_set_default((Integer)__ptr);
  free(op);
  free(__ptr);
  return IVar3;
}

Assistant:

Integer pnga_pgroup_split_irreg(Integer grp, Integer mycolor)
{
  Integer nprocs, me, default_grp, grp_id;
  Integer i, icnt=0;
  Integer *nodes, *color_arr;
  
  
  /* Allocate temporary arrays */
  nodes = (Integer*)malloc(GAnproc*sizeof(Integer));
  color_arr = (Integer*)malloc(GAnproc*sizeof(Integer));

  if(mycolor<0) pnga_error("Invalid argument (color < 0)",mycolor);

  default_grp = pnga_pgroup_get_default();
  pnga_pgroup_set_default(grp);
  nprocs = pnga_nnodes();
  me = pnga_nodeid();

  /* Figure out what procs are in my group */
  for(i=0; i<nprocs; i++) color_arr[i] = 0;
  color_arr[me] = mycolor;
  pnga_gop(pnga_type_f2c(MT_F_INT), color_arr, nprocs, "+");

  for (icnt=0, i=0; i<nprocs; i++) {
     if(color_arr[i] == mycolor) {
        nodes[icnt] = i;
        icnt++;
     }
  }

  grp_id = pnga_pgroup_create(nodes, icnt);

  pnga_pgroup_set_default(default_grp);

  /* Free temporary arrays */
  free(nodes);
  free(color_arr);


  return grp_id;
}